

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O1

void __thiscall
icu_63::TimeZoneNamesImpl::ZoneStringsLoader::ZoneStringsLoader
          (ZoneStringsLoader *this,TimeZoneNamesImpl *_tzn,UErrorCode *status)

{
  UHashtable *hash;
  
  (this->super_ResourceSink).super_UObject._vptr_UObject =
       (_func_int **)&PTR__ZoneStringsLoader_00479968;
  this->tzn = _tzn;
  hash = uhash_open_63(uhash_hashChars_63,uhash_compareChars_63,(undefined1 *)0x0,status);
  this->keyToLoader = hash;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    uhash_setKeyDeleter_63(hash,uprv_free_63);
    uhash_setValueDeleter_63(this->keyToLoader,deleteZNamesLoader);
  }
  return;
}

Assistant:

ZoneStringsLoader(TimeZoneNamesImpl& _tzn, UErrorCode& status)
            : tzn(_tzn) {
        keyToLoader = uhash_open(uhash_hashChars, uhash_compareChars, NULL, &status);
        if (U_FAILURE(status)) { return; }
        uhash_setKeyDeleter(keyToLoader, uprv_free);
        uhash_setValueDeleter(keyToLoader, deleteZNamesLoader);
    }